

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdbinarypacking.h
# Opt level: O1

void __thiscall
FastPForLib::SIMDBinaryPacking::encodeArray
          (SIMDBinaryPacking *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  long lVar1;
  uint32_t *puVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  uint32_t *puVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uint32_t *puVar17;
  ulong uVar18;
  uint32_t i;
  long lVar19;
  __m128i *out_00;
  ushort uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  uint32_t Bs [16];
  undefined1 local_88 [64];
  uint32_t *local_40;
  size_t *local_38;
  
  local_38 = nvalue;
  checkifdivisibleby(length,0x80);
  out_00 = (__m128i *)(out + 1);
  local_40 = out;
  *out = (uint32_t)length;
  puVar2 = in + length;
  if (0x7ff < (long)length) {
    puVar9 = in + 0x800;
    puVar17 = in;
    do {
      in = puVar9;
      puVar9 = puVar17;
      lVar19 = 0;
      do {
        lVar1 = lVar19 + 1;
        auVar22 = ZEXT1664((undefined1  [16])0x0);
        lVar13 = 0;
        do {
          auVar22 = vpord_avx512f(auVar22,*(undefined1 (*) [64])(puVar9 + lVar13));
          lVar13 = lVar13 + 0x10;
        } while (lVar13 != 0x80);
        auVar21 = vextracti64x4_avx512f(auVar22,1);
        auVar22 = vpord_avx512f(auVar22,ZEXT3264(auVar21));
        auVar4 = vpor_avx(auVar22._0_16_,auVar22._16_16_);
        auVar5 = vpshufd_avx(auVar4,0xee);
        auVar4 = vpor_avx(auVar4,auVar5);
        auVar5 = vpshufd_avx(auVar4,0x55);
        auVar4 = vpor_avx(auVar4,auVar5);
        iVar15 = 0x20 - LZCOUNT(auVar4._0_4_);
        if (auVar4._0_4_ == 0) {
          iVar15 = 0;
        }
        *(int *)(local_88 + lVar19 * 4) = iVar15;
        puVar9 = puVar9 + 0x80;
        lVar19 = lVar1;
      } while (lVar1 != 0x10);
      *(undefined4 *)*out_00 =
           local_88._8_4_ << 8 | local_88._4_4_ << 0x10 | local_88._0_4_ << 0x18 | local_88._12_4_;
      *(undefined4 *)((long)*out_00 + 4) =
           local_88._24_4_ << 8 | local_88._20_4_ << 0x10 | local_88._16_4_ << 0x18 |
           local_88._28_4_;
      *(undefined4 *)(*out_00 + 1) =
           local_88._40_4_ << 8 | local_88._36_4_ << 0x10 | local_88._32_4_ << 0x18 |
           local_88._44_4_;
      *(undefined4 *)((long)*out_00 + 0xc) =
           local_88._56_4_ << 8 | local_88._52_4_ << 0x10 | local_88._48_4_ << 0x18 |
           local_88._60_4_;
      out_00 = out_00 + 1;
      lVar19 = 0;
      puVar9 = puVar17;
      do {
        SIMD_fastpackwithoutmask_32(puVar9,out_00,*(uint32_t *)(local_88 + lVar19 * 4));
        out_00 = (__m128i *)
                 ((long)*out_00 + (ulong)(uint)(*(int *)(local_88 + lVar19 * 4) << 2) * 4);
        lVar19 = lVar19 + 1;
        puVar9 = puVar9 + 0x80;
      } while (lVar19 != 0x10);
      puVar17 = puVar17 + 0x800;
      puVar9 = in + 0x800;
    } while (in + 0x800 <= puVar2);
  }
  if (in < puVar2) {
    uVar11 = (long)puVar2 - (long)in >> 2;
    uVar18 = uVar11 + 0x7f;
    if ((long)uVar11 < 0) {
      uVar11 = uVar18;
    }
    local_88 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    if (0xfe < uVar18) {
      uVar10 = 0;
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar12 = 0x80;
      uVar14 = 0;
      do {
        auVar24 = vpbroadcastq_avx512f();
        auVar27 = ZEXT1664((undefined1  [16])0x0);
        uVar16 = 0;
        do {
          auVar25 = vmovdqa64_avx512f(auVar27);
          auVar27 = vpbroadcastq_avx512f();
          auVar26 = vporq_avx512f(auVar27,auVar22);
          auVar27 = vporq_avx512f(auVar27,auVar23);
          uVar6 = vpcmpuq_avx512f(auVar27,auVar24,2);
          bVar7 = (byte)uVar6;
          uVar6 = vpcmpuq_avx512f(auVar26,auVar24,2);
          bVar8 = (byte)uVar6;
          uVar20 = CONCAT11(bVar8,bVar7);
          auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])(in + uVar10 + uVar16));
          auVar26._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar27._4_4_;
          auVar26._0_4_ = (uint)(bVar7 & 1) * auVar27._0_4_;
          auVar26._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar27._8_4_;
          auVar26._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar27._12_4_;
          auVar26._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar27._16_4_;
          auVar26._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar27._20_4_;
          auVar26._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar27._24_4_;
          auVar26._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar27._28_4_;
          auVar26._32_4_ = (uint)(bVar8 & 1) * auVar27._32_4_;
          auVar26._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar27._36_4_;
          auVar26._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar27._40_4_;
          auVar26._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar27._44_4_;
          auVar26._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar27._48_4_;
          auVar26._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar27._52_4_;
          auVar26._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar27._56_4_;
          auVar26._60_4_ = (uint)(bVar8 >> 7) * auVar27._60_4_;
          auVar27 = vpord_avx512f(auVar26,auVar25);
          uVar16 = uVar16 + 0x10;
        } while (((((ulong)uVar12 * 4 + (ulong)uVar10 * -4) - 4 >> 2) + 0x10 & 0xfffffffffffffff0)
                 != uVar16);
        auVar24 = vmovdqa32_avx512f(auVar27);
        auVar27._0_4_ = (uint)(bVar7 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar25._0_4_
        ;
        bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar27._4_4_ = (uint)bVar3 * auVar24._4_4_ | (uint)!bVar3 * auVar25._4_4_;
        bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar27._8_4_ = (uint)bVar3 * auVar24._8_4_ | (uint)!bVar3 * auVar25._8_4_;
        bVar3 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar27._12_4_ = (uint)bVar3 * auVar24._12_4_ | (uint)!bVar3 * auVar25._12_4_;
        bVar3 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar27._16_4_ = (uint)bVar3 * auVar24._16_4_ | (uint)!bVar3 * auVar25._16_4_;
        bVar3 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar27._20_4_ = (uint)bVar3 * auVar24._20_4_ | (uint)!bVar3 * auVar25._20_4_;
        bVar3 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar27._24_4_ = (uint)bVar3 * auVar24._24_4_ | (uint)!bVar3 * auVar25._24_4_;
        bVar3 = (bool)((byte)(uVar20 >> 7) & 1);
        auVar27._28_4_ = (uint)bVar3 * auVar24._28_4_ | (uint)!bVar3 * auVar25._28_4_;
        auVar27._32_4_ =
             (uint)(bVar8 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar25._32_4_;
        bVar3 = (bool)(bVar8 >> 1 & 1);
        auVar27._36_4_ = (uint)bVar3 * auVar24._36_4_ | (uint)!bVar3 * auVar25._36_4_;
        bVar3 = (bool)(bVar8 >> 2 & 1);
        auVar27._40_4_ = (uint)bVar3 * auVar24._40_4_ | (uint)!bVar3 * auVar25._40_4_;
        bVar3 = (bool)(bVar8 >> 3 & 1);
        auVar27._44_4_ = (uint)bVar3 * auVar24._44_4_ | (uint)!bVar3 * auVar25._44_4_;
        bVar3 = (bool)(bVar8 >> 4 & 1);
        auVar27._48_4_ = (uint)bVar3 * auVar24._48_4_ | (uint)!bVar3 * auVar25._48_4_;
        bVar3 = (bool)(bVar8 >> 5 & 1);
        auVar27._52_4_ = (uint)bVar3 * auVar24._52_4_ | (uint)!bVar3 * auVar25._52_4_;
        bVar3 = (bool)(bVar8 >> 6 & 1);
        auVar27._56_4_ = (uint)bVar3 * auVar24._56_4_ | (uint)!bVar3 * auVar25._56_4_;
        auVar27._60_4_ =
             (uint)(bVar8 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar25._60_4_;
        auVar21 = vextracti64x4_avx512f(auVar27,1);
        auVar24 = vpord_avx512f(auVar27,ZEXT3264(auVar21));
        auVar4 = vpor_avx(auVar24._0_16_,auVar24._16_16_);
        auVar5 = vpshufd_avx(auVar4,0xee);
        auVar4 = vpor_avx(auVar4,auVar5);
        auVar5 = vpshufd_avx(auVar4,0x55);
        auVar4 = vpor_avx(auVar4,auVar5);
        iVar15 = 0x20 - LZCOUNT(auVar4._0_4_);
        if (auVar4._0_4_ == 0) {
          iVar15 = 0;
        }
        *(int *)(local_88 + uVar14 * 4) = iVar15;
        uVar14 = (ulong)((int)uVar14 + 1);
        uVar10 = uVar10 + 0x80;
        uVar12 = uVar12 + 0x80;
      } while (uVar14 < (ulong)((long)uVar11 >> 7));
    }
    *(undefined4 *)*out_00 =
         local_88._8_4_ << 8 | local_88._4_4_ << 0x10 | local_88._0_4_ << 0x18 | local_88._12_4_;
    *(undefined4 *)((long)*out_00 + 4) =
         local_88._24_4_ << 8 | local_88._20_4_ << 0x10 | local_88._16_4_ << 0x18 | local_88._28_4_;
    *(undefined4 *)(*out_00 + 1) =
         local_88._40_4_ << 8 | local_88._36_4_ << 0x10 | local_88._32_4_ << 0x18 | local_88._44_4_;
    *(undefined4 *)((long)*out_00 + 0xc) =
         local_88._56_4_ << 8 | local_88._52_4_ << 0x10 | local_88._48_4_ << 0x18 | local_88._60_4_;
    out_00 = out_00 + 1;
    if (0xfe < uVar18) {
      uVar16 = 0;
      uVar18 = 0;
      uVar14 = 1;
      do {
        SIMD_fastpackwithoutmask_32(in + uVar16,out_00,*(uint32_t *)(local_88 + uVar18 * 4));
        out_00 = (__m128i *)
                 ((long)*out_00 + (ulong)(uint)(*(int *)(local_88 + uVar18 * 4) << 2) * 4);
        uVar16 = (ulong)((int)uVar16 + 0x80);
        bVar3 = uVar14 < (ulong)((long)uVar11 >> 7);
        uVar18 = uVar14;
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (bVar3);
    }
  }
  *local_38 = (long)out_00 - (long)local_40 >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    checkifdivisibleby(length, BlockSize);
    const uint32_t *const initout(out);
    *out++ = static_cast<uint32_t>(length);
    uint32_t Bs[HowManyMiniBlocks];
    const uint32_t *const final = in + length;
    for (; in + HowManyMiniBlocks * MiniBlockSize <= final;
         in += HowManyMiniBlocks * MiniBlockSize) {

      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      *out++ = (Bs[4] << 24) | (Bs[5] << 16) | (Bs[6] << 8) | Bs[7];
      *out++ = (Bs[8] << 24) | (Bs[9] << 16) | (Bs[10] << 8) | Bs[11];
      *out++ = (Bs[12] << 24) | (Bs[13] << 16) | (Bs[14] << 8) | Bs[15];
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        SIMD_fastpackwithoutmask_32(in + i * MiniBlockSize,
                                    reinterpret_cast<__m128i *>(out), Bs[i]);
        out += MiniBlockSize / 32 * Bs[i];
      }
    }
    if (in < final) {
      const size_t howmany = (final - in) / MiniBlockSize;
      memset(&Bs[0], 0, HowManyMiniBlocks * sizeof(uint32_t));
      for (uint32_t i = 0; i < howmany; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      *out++ = (Bs[4] << 24) | (Bs[5] << 16) | (Bs[6] << 8) | Bs[7];
      *out++ = (Bs[8] << 24) | (Bs[9] << 16) | (Bs[10] << 8) | Bs[11];
      *out++ = (Bs[12] << 24) | (Bs[13] << 16) | (Bs[14] << 8) | Bs[15];
      for (uint32_t i = 0; i < howmany; ++i) {
        SIMD_fastpackwithoutmask_32(in + i * MiniBlockSize,
                                    reinterpret_cast<__m128i *>(out), Bs[i]);
        out += MiniBlockSize / 32 * Bs[i];
      }
      in += howmany * MiniBlockSize;
      assert(in == final);
    }

    nvalue = out - initout;
  }